

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O0

DictionaryValue * __thiscall
CoreML::Specification::MILSpec::Value_ImmediateValue::mutable_dictionary(Value_ImmediateValue *this)

{
  bool bVar1;
  DictionaryValue *this_00;
  Value_ImmediateValue *this_local;
  
  bVar1 = has_dictionary(this);
  if (!bVar1) {
    clear_value(this);
    set_has_dictionary(this);
    this_00 = (DictionaryValue *)operator_new(0x30);
    DictionaryValue::DictionaryValue(this_00);
    (this->value_).dictionary_ = this_00;
  }
  return (DictionaryValue *)(this->value_).tensor_;
}

Assistant:

inline ::CoreML::Specification::MILSpec::DictionaryValue* Value_ImmediateValue::mutable_dictionary() {
  if (!has_dictionary()) {
    clear_value();
    set_has_dictionary();
    value_.dictionary_ = new ::CoreML::Specification::MILSpec::DictionaryValue;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.MILSpec.Value.ImmediateValue.dictionary)
  return value_.dictionary_;
}